

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void * tdefl_write_image_to_png_file_in_memory_ex
                 (void *pImage,int w,int h,int num_chans,size_t *pLen_out,mz_uint level,mz_bool flip
                 )

{
  tdefl_status tVar1;
  mz_bool mVar2;
  mz_ulong mVar3;
  mz_uint32 local_d4;
  uint local_bc;
  int local_ac;
  undefined1 local_a8;
  undefined1 local_a7;
  undefined1 local_a6;
  undefined1 local_a5;
  undefined1 local_a4;
  undefined1 local_a3;
  undefined1 local_a2;
  undefined1 local_a1;
  mz_uint8 pnghdr [41];
  int local_74;
  int local_70;
  mz_uint32 c;
  int z;
  int y;
  int bpl;
  int i;
  tdefl_output_buffer out_buf;
  tdefl_compressor *pComp;
  mz_uint level_local;
  size_t *pLen_out_local;
  int num_chans_local;
  int h_local;
  int w_local;
  void *pImage_local;
  
  out_buf._24_8_ = malloc(0x4df78);
  z = w * num_chans;
  *pLen_out = 0;
  if ((void *)out_buf._24_8_ == (void *)0x0) {
    pImage_local = (void *)0x0;
  }
  else {
    memset(&bpl,0,0x20);
    out_buf.m_pBuf._0_4_ = 1;
    if ((z + 1) * h < 0x40) {
      local_ac = 0x40;
    }
    else {
      local_ac = (z + 1) * h;
    }
    out_buf.m_size = (size_t)(local_ac + 0x39);
    out_buf.m_capacity = (size_t)malloc(out_buf.m_size);
    if ((void *)out_buf.m_capacity == (void *)0x0) {
      free((void *)out_buf._24_8_);
      pImage_local = (void *)0x0;
    }
    else {
      for (local_70 = 0x29; local_70 != 0; local_70 = local_70 + -1) {
        (anonymous_namespace)::miniz::tdefl_output_buffer_putter(&local_70,1,&bpl);
      }
      local_bc = level;
      if (10 < level) {
        local_bc = 10;
      }
      tdefl_init((tdefl_compressor *)out_buf._24_8_,
                 (anonymous_namespace)::miniz::tdefl_output_buffer_putter,&bpl,
                 tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[local_bc] |
                 0x1000);
      for (c = 0; (int)c < h; c = c + 1) {
        tdefl_compress_buffer((tdefl_compressor *)out_buf._24_8_,&local_70,1,TDEFL_NO_FLUSH);
        if (flip == 0) {
          local_d4 = c;
        }
        else {
          local_d4 = (h + -1) - c;
        }
        tdefl_compress_buffer
                  ((tdefl_compressor *)out_buf._24_8_,
                   (void *)((long)pImage + (long)(int)(local_d4 * z)),(long)z,TDEFL_NO_FLUSH);
      }
      tVar1 = tdefl_compress_buffer((tdefl_compressor *)out_buf._24_8_,(void *)0x0,0,TDEFL_FINISH);
      if (tVar1 == TDEFL_STATUS_DONE) {
        *pLen_out = _bpl - 0x29;
        local_a8 = 0x89;
        local_a7 = 0x50;
        local_a6 = 0x4e;
        local_a5 = 0x47;
        local_a4 = 0xd;
        local_a3 = 10;
        local_a2 = 0x1a;
        local_a1 = 10;
        pnghdr[0] = '\0';
        pnghdr[1] = '\0';
        pnghdr[2] = '\0';
        pnghdr[3] = '\r';
        pnghdr[4] = 'I';
        pnghdr[5] = 'H';
        pnghdr[6] = 'D';
        pnghdr[7] = 'R';
        pnghdr[8] = '\0';
        pnghdr[9] = '\0';
        pnghdr[10] = (mz_uint8)((uint)w >> 8);
        pnghdr[0xb] = (mz_uint8)w;
        pnghdr[0xc] = '\0';
        pnghdr[0xd] = '\0';
        pnghdr[0xe] = (mz_uint8)((uint)h >> 8);
        pnghdr[0xf] = (mz_uint8)h;
        pnghdr[0x10] = '\b';
        pnghdr[0x11] = ""[num_chans];
        pnghdr[0x12] = '\0';
        pnghdr[0x13] = '\0';
        pnghdr[0x14] = '\0';
        pnghdr[0x15] = '\0';
        pnghdr[0x16] = '\0';
        pnghdr[0x17] = '\0';
        pnghdr[0x18] = '\0';
        pnghdr[0x19] = (mz_uint8)(*pLen_out >> 0x18);
        pnghdr[0x1a] = (mz_uint8)(*pLen_out >> 0x10);
        pnghdr[0x1b] = (mz_uint8)(*pLen_out >> 8);
        pnghdr[0x1c] = (mz_uint8)*pLen_out;
        builtin_memcpy(pnghdr + 0x1d,"IDAT",4);
        mVar3 = mz_crc32(0,pnghdr + 4,0x11);
        local_74 = (int)mVar3;
        for (y = 0; y < 4; y = y + 1) {
          pnghdr[(long)y + 0x15] = (mz_uint8)((uint)local_74 >> 0x18);
          local_74 = local_74 << 8;
        }
        memcpy((void *)out_buf.m_capacity,&local_a8,0x29);
        mVar2 = (anonymous_namespace)::miniz::tdefl_output_buffer_putter("",0x10,&bpl);
        if (mVar2 == 0) {
          *pLen_out = 0;
          free((void *)out_buf._24_8_);
          free((void *)out_buf.m_capacity);
          pImage_local = (void *)0x0;
        }
        else {
          mVar3 = mz_crc32(0,(mz_uint8 *)(out_buf.m_capacity + 0x25),*pLen_out + 4);
          local_74 = (int)mVar3;
          for (y = 0; y < 4; y = y + 1) {
            *(char *)(out_buf.m_capacity + _bpl + -0x10 + (long)y) = (char)((uint)local_74 >> 0x18);
            local_74 = local_74 << 8;
          }
          *pLen_out = *pLen_out + 0x39;
          free((void *)out_buf._24_8_);
          pImage_local = (void *)out_buf.m_capacity;
        }
      }
      else {
        free((void *)out_buf._24_8_);
        free((void *)out_buf.m_capacity);
        pImage_local = (void *)0x0;
      }
    }
  }
  return pImage_local;
}

Assistant:

void *tdefl_write_image_to_png_file_in_memory_ex(const void *pImage, int w,
                                                 int h, int num_chans,
                                                 size_t *pLen_out,
                                                 mz_uint level, mz_bool flip) {
  // Using a local copy of this array here in case MINIZ_NO_ZLIB_APIS was
  // defined.
  static const mz_uint s_tdefl_png_num_probes[11] = {
      0, 1, 6, 32, 16, 32, 128, 256, 512, 768, 1500};
  tdefl_compressor *pComp =
      (tdefl_compressor *)MZ_MALLOC(sizeof(tdefl_compressor));
  tdefl_output_buffer out_buf;
  int i, bpl = w * num_chans, y, z;
  mz_uint32 c;
  *pLen_out = 0;
  if (!pComp)
    return NULL;
  MZ_CLEAR_OBJ(out_buf);
  out_buf.m_expandable = MZ_TRUE;
  out_buf.m_capacity = 57 + MZ_MAX(64, (1 + bpl) * h);
  if (NULL == (out_buf.m_pBuf = (mz_uint8 *)MZ_MALLOC(out_buf.m_capacity))) {
    MZ_FREE(pComp);
    return NULL;
  }
  // write dummy header
  for (z = 41; z; --z)
    tdefl_output_buffer_putter(&z, 1, &out_buf);
  // compress image data
  tdefl_init(pComp, tdefl_output_buffer_putter, &out_buf,
             s_tdefl_png_num_probes[MZ_MIN(10, level)] |
                 TDEFL_WRITE_ZLIB_HEADER);
  for (y = 0; y < h; ++y) {
    tdefl_compress_buffer(pComp, &z, 1, TDEFL_NO_FLUSH);
    tdefl_compress_buffer(pComp,
                          (mz_uint8 *)pImage + (flip ? (h - 1 - y) : y) * bpl,
                          bpl, TDEFL_NO_FLUSH);
  }
  if (tdefl_compress_buffer(pComp, NULL, 0, TDEFL_FINISH) !=
      TDEFL_STATUS_DONE) {
    MZ_FREE(pComp);
    MZ_FREE(out_buf.m_pBuf);
    return NULL;
  }
  // write real header
  *pLen_out = out_buf.m_size - 41;
  {
    static const mz_uint8 chans[] = {0x00, 0x00, 0x04, 0x02, 0x06};
    mz_uint8 pnghdr[41] = {
        0x89, 0x50, 0x4e, 0x47, 0x0d, 0x0a, 0x1a, 0x0a, 0x00, 0x00, 0x00, 0x0d,
        0x49, 0x48, 0x44, 0x52, 0, 0, (mz_uint8)(w >> 8), (mz_uint8)w, 0, 0,
        (mz_uint8)(h >> 8), (mz_uint8)h, 8, chans[num_chans], 0, 0, 0, 0, 0, 0,
        0, (mz_uint8)(*pLen_out >> 24), (mz_uint8)(*pLen_out >> 16),
        (mz_uint8)(*pLen_out >> 8), (mz_uint8)*pLen_out, 0x49, 0x44, 0x41,
        0x54};
    c = (mz_uint32)mz_crc32(MZ_CRC32_INIT, pnghdr + 12, 17);
    for (i = 0; i < 4; ++i, c <<= 8)
      ((mz_uint8 *)(pnghdr + 29))[i] = (mz_uint8)(c >> 24);
    memcpy(out_buf.m_pBuf, pnghdr, 41);
  }
  // write footer (IDAT CRC-32, followed by IEND chunk)
  if (!tdefl_output_buffer_putter(
          "\0\0\0\0\0\0\0\0\x49\x45\x4e\x44\xae\x42\x60\x82", 16, &out_buf)) {
    *pLen_out = 0;
    MZ_FREE(pComp);
    MZ_FREE(out_buf.m_pBuf);
    return NULL;
  }
  c = (mz_uint32)mz_crc32(MZ_CRC32_INIT, out_buf.m_pBuf + 41 - 4,
                          *pLen_out + 4);
  for (i = 0; i < 4; ++i, c <<= 8)
    (out_buf.m_pBuf + out_buf.m_size - 16)[i] = (mz_uint8)(c >> 24);
  // compute final size of file, grab compressed data buffer and return
  *pLen_out += 57;
  MZ_FREE(pComp);
  return out_buf.m_pBuf;
}